

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_get_standard_channel_map_sndio(ma_uint32 channels,ma_channel *channelMap)

{
  uint local_1c;
  ma_uint32 iChannel;
  ma_channel *channelMap_local;
  ma_uint32 channels_local;
  
  switch(channels) {
  case 1:
    *channelMap = '\x01';
    break;
  case 2:
    *channelMap = '\x02';
    channelMap[1] = '\x03';
    break;
  case 3:
    *channelMap = '\x02';
    channelMap[1] = '\x03';
    channelMap[2] = '\x04';
    break;
  case 4:
    builtin_memcpy(channelMap,"\x02\x03\x06\a",4);
    break;
  case 5:
    builtin_memcpy(channelMap,"\x02\x03\x06\a\x04",5);
    break;
  case 6:
  default:
    builtin_memcpy(channelMap,"\x02\x03\x06\a\x04\x05",6);
  }
  if (6 < channels) {
    for (local_1c = 6; local_1c < 0x20; local_1c = local_1c + 1) {
      channelMap[local_1c] = (char)local_1c + '\x0e';
    }
  }
  return;
}

Assistant:

static void ma_get_standard_channel_map_sndio(ma_uint32 channels, ma_channel channelMap[MA_MAX_CHANNELS])
{
    switch (channels)
    {
        case 1:
        {
            channelMap[0] = MA_CHANNEL_MONO;
        } break;

        case 2:
        {
            channelMap[0] = MA_CHANNEL_LEFT;
            channelMap[1] = MA_CHANNEL_RIGHT;
        } break;

        case 3:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
        } break;

        case 4:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_BACK_LEFT;
            channelMap[3] = MA_CHANNEL_BACK_RIGHT;
        } break;

        case 5:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_BACK_LEFT;
            channelMap[3] = MA_CHANNEL_BACK_RIGHT;
            channelMap[4] = MA_CHANNEL_FRONT_CENTER;
        } break;

        case 6:
        default:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_BACK_LEFT;
            channelMap[3] = MA_CHANNEL_BACK_RIGHT;
            channelMap[4] = MA_CHANNEL_FRONT_CENTER;
            channelMap[5] = MA_CHANNEL_LFE;
        } break;
    }

    /* Remainder. */
    if (channels > 6) {
        ma_uint32 iChannel;
        for (iChannel = 6; iChannel < MA_MAX_CHANNELS; ++iChannel) {
            channelMap[iChannel] = (ma_channel)(MA_CHANNEL_AUX_0 + (iChannel-6));
        }
    }
}